

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bio_test.cc
# Opt level: O0

void __thiscall anon_unknown.dwarf_7517a::BIOTest_Printf_Test::TestBody(BIOTest_Printf_Test *this)

{
  size_type __n;
  bool bVar1;
  BIO_METHOD *type;
  BIO *pBVar2;
  char *pcVar3;
  undefined8 uVar4;
  pointer pbVar5;
  size_t extraout_RDX;
  char *in_R9;
  string_view sVar6;
  Span<const_unsigned_char> b;
  string local_218;
  AssertHelper local_1f8;
  Message local_1f0;
  int local_1e4;
  undefined1 local_1e0 [8];
  AssertionResult gtest_ar__2;
  Message local_1c8;
  Span<const_unsigned_char> local_1c0;
  string_view local_1b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0;
  undefined1 local_180 [8];
  AssertionResult gtest_ar_2;
  AssertHelper local_150;
  Message local_148;
  int local_13c;
  undefined1 local_138 [8];
  AssertionResult gtest_ar__1;
  size_t len;
  uint8_t *contents;
  Message local_110;
  unsigned_long local_108;
  unsigned_long local_100;
  undefined1 local_f8 [8];
  AssertionResult gtest_ar_1;
  Message local_e0;
  int local_d4;
  undefined1 local_d0 [8];
  AssertionResult gtest_ar;
  int ret;
  string in;
  size_type sStack_90;
  ScopedTrace gtest_trace_346;
  size_t length;
  size_t *__end1;
  size_t *__begin1;
  size_t (*__range1) [7];
  string local_68;
  AssertHelper local_48;
  Message local_40 [3];
  undefined1 local_28 [8];
  AssertionResult gtest_ar_;
  UniquePtr<BIO> bio;
  BIOTest_Printf_Test *this_local;
  
  type = BIO_s_mem();
  pBVar2 = BIO_new(type);
  std::unique_ptr<bio_st,bssl::internal::Deleter>::unique_ptr<bssl::internal::Deleter,void>
            ((unique_ptr<bio_st,bssl::internal::Deleter> *)&gtest_ar_.message_,(pointer)pBVar2);
  testing::AssertionResult::AssertionResult<std::unique_ptr<bio_st,bssl::internal::Deleter>>
            ((AssertionResult *)local_28,
             (unique_ptr<bio_st,_bssl::internal::Deleter> *)&gtest_ar_.message_,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_28);
  if (!bVar1) {
    testing::Message::Message(local_40);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_68,(internal *)local_28,(AssertionResult *)0x8a2d4f,"false","true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_48,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bio/bio_test.cc"
               ,0x157,pcVar3);
    testing::internal::AssertHelper::operator=(&local_48,local_40);
    testing::internal::AssertHelper::~AssertHelper(&local_48);
    std::__cxx11::string::~string((string *)&local_68);
    testing::Message::~Message(local_40);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_28);
  if (bVar1) {
    for (__end1 = TestBody::kLengths;
        __end1 != (size_t *)
                  "N7testing8internal15TestFactoryImplIN12_GLOBAL__N_121BIOTest_ReadASN1_TestEEE";
        __end1 = __end1 + 1) {
      sStack_90 = *__end1;
      testing::ScopedTrace::ScopedTrace<unsigned_long>
                ((ScopedTrace *)(in.field_2._M_local_buf + 0xf),
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bio/bio_test.cc"
                 ,0x15a,&stack0xffffffffffffff70);
      __n = sStack_90;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&ret,__n,'a',
                 (allocator<char> *)
                 ((long)&gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                 + 7));
      std::allocator<char>::~allocator
                ((allocator<char> *)
                 ((long)&gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                 + 7));
      pBVar2 = (BIO *)std::unique_ptr<bio_st,_bssl::internal::Deleter>::get
                                ((unique_ptr<bio_st,_bssl::internal::Deleter> *)&gtest_ar_.message_)
      ;
      uVar4 = std::__cxx11::string::c_str();
      gtest_ar.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._0_4_ = BIO_printf(pBVar2,"test %s",uVar4);
      local_d4 = 0;
      testing::internal::CmpHelperGE<int,int>
                ((internal *)local_d0,"ret","0",(int *)&gtest_ar.message_,&local_d4);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d0);
      if (!bVar1) {
        testing::Message::Message(&local_e0);
        pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_d0);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_1.message_,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bio/bio_test.cc"
                   ,0x15f,pcVar3);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_e0);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
        testing::Message::~Message(&local_e0);
      }
      bVar1 = !bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_d0);
      if (!bVar1) {
        local_100 = sStack_90 + 5;
        local_108 = (unsigned_long)
                    (int)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
        testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
                  ((EqHelper *)local_f8,"5 + length","static_cast<size_t>(ret)",&local_100,
                   &local_108);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f8);
        if (!bVar1) {
          testing::Message::Message(&local_110);
          pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_f8);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&contents,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bio/bio_test.cc"
                     ,0x160,pcVar3);
          testing::internal::AssertHelper::operator=((AssertHelper *)&contents,&local_110);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&contents);
          testing::Message::~Message(&local_110);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_f8);
        pbVar5 = std::unique_ptr<bio_st,_bssl::internal::Deleter>::get
                           ((unique_ptr<bio_st,_bssl::internal::Deleter> *)&gtest_ar_.message_);
        local_13c = BIO_mem_contents(pbVar5,(uint8_t **)&len,(size_t *)&gtest_ar__1.message_);
        testing::AssertionResult::AssertionResult<int>
                  ((AssertionResult *)local_138,&local_13c,(type *)0x0);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_138);
        if (!bVar1) {
          testing::Message::Message(&local_148);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&gtest_ar_2.message_,(internal *)local_138,
                     (AssertionResult *)"BIO_mem_contents(bio.get(), &contents, &len)","false",
                     "true",in_R9);
          pcVar3 = (char *)std::__cxx11::string::c_str();
          testing::internal::AssertHelper::AssertHelper
                    (&local_150,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bio/bio_test.cc"
                     ,0x164,pcVar3);
          testing::internal::AssertHelper::operator=(&local_150,&local_148);
          testing::internal::AssertHelper::~AssertHelper(&local_150);
          std::__cxx11::string::~string((string *)&gtest_ar_2.message_);
          testing::Message::~Message(&local_148);
        }
        bVar1 = !bVar1;
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_138);
        if (!bVar1) {
          std::operator+(&local_1a0,"test ",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ret);
          bssl::Span<const_unsigned_char>::Span
                    (&local_1c0,(uchar *)len,
                     (size_t)gtest_ar__1.message_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             ._M_head_impl);
          b.size_ = extraout_RDX;
          b.data_ = (uchar *)local_1c0.size_;
          sVar6 = bssl::BytesAsStringView((bssl *)local_1c0.data_,b);
          local_1b0 = sVar6;
          testing::internal::EqHelper::
          Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_nullptr>
                    ((EqHelper *)local_180,"\"test \" + in",
                     "bssl::BytesAsStringView(bssl::Span(contents, len))",&local_1a0,&local_1b0);
          std::__cxx11::string::~string((string *)&local_1a0);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_180);
          if (!bVar1) {
            testing::Message::Message(&local_1c8);
            pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_180);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&gtest_ar__2.message_,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bio/bio_test.cc"
                       ,0x165,pcVar3);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&gtest_ar__2.message_,&local_1c8);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__2.message_);
            testing::Message::~Message(&local_1c8);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_180);
          pbVar5 = std::unique_ptr<bio_st,_bssl::internal::Deleter>::get
                             ((unique_ptr<bio_st,_bssl::internal::Deleter> *)&gtest_ar_.message_);
          local_1e4 = BIO_reset(pbVar5);
          testing::AssertionResult::AssertionResult<int>
                    ((AssertionResult *)local_1e0,&local_1e4,(type *)0x0);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1e0);
          if (!bVar1) {
            testing::Message::Message(&local_1f0);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      (&local_218,(internal *)local_1e0,(AssertionResult *)"BIO_reset(bio.get())",
                       "false","true",in_R9);
            pcVar3 = (char *)std::__cxx11::string::c_str();
            testing::internal::AssertHelper::AssertHelper
                      (&local_1f8,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bio/bio_test.cc"
                       ,0x167,pcVar3);
            testing::internal::AssertHelper::operator=(&local_1f8,&local_1f0);
            testing::internal::AssertHelper::~AssertHelper(&local_1f8);
            std::__cxx11::string::~string((string *)&local_218);
            testing::Message::~Message(&local_1f0);
          }
          bVar1 = !bVar1;
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_1e0);
          if (!bVar1) {
            bVar1 = false;
          }
        }
      }
      std::__cxx11::string::~string((string *)&ret);
      testing::ScopedTrace::~ScopedTrace((ScopedTrace *)(in.field_2._M_local_buf + 0xf));
      if (bVar1) break;
    }
  }
  std::unique_ptr<bio_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<bio_st,_bssl::internal::Deleter> *)&gtest_ar_.message_);
  return;
}

Assistant:

TEST(BIOTest, Printf) {
  // Test a short output, a very long one, and various sizes around
  // 256 (the size of the buffer) to ensure edge cases are correct.
  static const size_t kLengths[] = {5, 250, 251, 252, 253, 254, 1023};

  bssl::UniquePtr<BIO> bio(BIO_new(BIO_s_mem()));
  ASSERT_TRUE(bio);

  for (size_t length : kLengths) {
    SCOPED_TRACE(length);

    std::string in(length, 'a');

    int ret = BIO_printf(bio.get(), "test %s", in.c_str());
    ASSERT_GE(ret, 0);
    EXPECT_EQ(5 + length, static_cast<size_t>(ret));

    const uint8_t *contents;
    size_t len;
    ASSERT_TRUE(BIO_mem_contents(bio.get(), &contents, &len));
    EXPECT_EQ("test " + in, bssl::BytesAsStringView(bssl::Span(contents, len)));

    ASSERT_TRUE(BIO_reset(bio.get()));
  }
}